

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table_test.cc
# Opt level: O0

void __thiscall
StackTraceTableTestHelper::CheckTracesAndReset
          (StackTraceTableTestHelper *this,uintptr_t *expected,int len)

{
  bool bVar1;
  type ppvVar2;
  char *message;
  AssertHelper local_68;
  Message local_60 [3];
  void *local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  int i;
  unique_ptr<void_*[],_std::default_delete<void_*[]>_> entries;
  int len_local;
  uintptr_t *expected_local;
  StackTraceTableTestHelper *this_local;
  
  entries._M_t.super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
  super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
  super__Head_base<0UL,_void_**,_false>._M_head_impl._4_4_ = len;
  DumpTraces((StackTraceTableTestHelper *)&stack0xffffffffffffffd8);
  for (gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ <
      entries._M_t.super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
      super__Head_base<0UL,_void_**,_false>._M_head_impl._4_4_;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ =
           gtest_ar.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ + 1) {
    ppvVar2 = std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::operator[]
                        ((unique_ptr<void_*[],_std::default_delete<void_*[]>_> *)
                         &stack0xffffffffffffffd8,
                         (long)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_);
    local_48 = *ppvVar2;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_40,"reinterpret_cast<uintptr_t>(entries[i])","expected[i]",
               (unsigned_long *)&local_48,
               expected +
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._4_4_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
    if (!bVar1) {
      testing::Message::Message(local_60);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_40);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/stack_trace_table_test.cc"
                 ,0x33,message);
      testing::internal::AssertHelper::operator=(&local_68,local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      testing::Message::~Message(local_60);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  }
  std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::~unique_ptr
            ((unique_ptr<void_*[],_std::default_delete<void_*[]>_> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void CheckTracesAndReset(const uintptr_t* expected, int len) {
    std::unique_ptr<void*[]> entries = DumpTraces();
    for (int i = 0; i < len; i++) {
      EXPECT_EQ(reinterpret_cast<uintptr_t>(entries[i]), expected[i]);
    }
  }